

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_zeropage_x_instructions.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::NopZeroXFixture_nop_zerox_Test::~NopZeroXFixture_nop_zerox_Test
          (NopZeroXFixture_nop_zerox_Test *this)

{
  anon_unknown.dwarf_23dddf::NopZeroXFixture_nop_zerox_Test::~NopZeroXFixture_nop_zerox_Test
            ((NopZeroXFixture_nop_zerox_Test *)(this + -0x118));
  return;
}

Assistant:

TEST_P(NopZeroXFixture, nop_zerox) {
    stage_instruction(GetParam());
    expected.x = registers.x = 0x01;
    expected.pc += 1;
    EXPECT_CALL(mmu, read_byte(registers.pc + 1)).WillOnce(Return(0xCD));
    EXPECT_CALL(mmu, read_byte(0xCD)).WillOnce(Return(0xFD)); // Dummy read

    step_execution(4);
    EXPECT_EQ(expected, registers);
}